

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O0

UINT8 ymf271_r(void *info,UINT8 offset)

{
  UINT8 UVar1;
  UINT8 ret;
  YMF271Chip *chip;
  UINT8 offset_local;
  void *info_local;
  
  if ((offset & 0xf) == 0) {
    info_local._7_1_ =
         *(byte *)((long)info + 0x2d85) | (byte)((*(ushort *)((long)info + 0x2d86) & 0xf) << 3);
  }
  else if ((offset & 0xf) == 1) {
    info_local._7_1_ = (byte)((int)(uint)*(ushort *)((long)info + 0x2d86) >> 4);
  }
  else if ((offset & 0xf) == 2) {
    if (*(char *)((long)info + 0x2d90) == '\0') {
      info_local._7_1_ = 0xff;
    }
    else {
      info_local._7_1_ = *(byte *)((long)info + 0x2d91);
      *(uint *)((long)info + 0x2d8c) = *(int *)((long)info + 0x2d8c) + 1U & 0x7fffff;
      UVar1 = ymf271_read_memory((YMF271Chip *)info,*(UINT32 *)((long)info + 0x2d8c));
      *(UINT8 *)((long)info + 0x2d91) = UVar1;
    }
  }
  else {
    info_local._7_1_ = 0xff;
  }
  return info_local._7_1_;
}

Assistant:

static UINT8 ymf271_r(void *info, UINT8 offset)
{
	YMF271Chip *chip = (YMF271Chip *)info;

	switch (offset & 0xf)
	{
		case 0x0:
			return chip->status | ((chip->end_status & 0xf) << 3);

		case 0x1:
			// statusreg 2
			return chip->end_status >> 4;

		case 0x2:
		{
			UINT8 ret;
			if (!chip->ext_rw)
				return 0xff;

			ret = chip->ext_readlatch;
			chip->ext_address = (chip->ext_address + 1) & 0x7fffff;
			chip->ext_readlatch = ymf271_read_memory(chip, chip->ext_address);
			return ret;
		}

		default:
			break;
	}

	return 0xff;
}